

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O0

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::send_msg_to_leader
          (raft_server *this,ptr<req_msg> *req,req_ext_params *ext_params)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  int *piVar8;
  element_type *peVar9;
  size_type sVar10;
  size_type sVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  string *psVar15;
  element_type *peVar16;
  undefined8 in_RCX;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  element_type *in_RDI;
  pair<std::__detail::_Node_iterator<std::shared_ptr<nuraft::rpc_client>,_true,_false>,_bool> pVar17
  ;
  ptr<cmd_result<ptr<buffer>_>_> pVar18;
  rpc_handler handler;
  ptr<srv_config> srv_conf_1;
  lock_guard<std::mutex> guard_1;
  auto_fwd_req_resp req_resp_pair;
  ptr<srv_config> srv_conf;
  iterator e_rpc;
  unique_lock<std::mutex> l;
  iterator entry;
  lock_guard<std::mutex> guard;
  ptr<auto_fwd_pkg> cur_pkg;
  ptr<rpc_client> rpc_cli;
  ptr<cluster_config> c_conf;
  bool is_blocking_mode;
  size_t max_conns;
  ptr<raft_params> params;
  ptr<resp_msg> resp;
  ptr<buffer> result;
  int32 leader_id;
  ptr<cmd_result<ptr<buffer>_>_> *presult;
  resp_msg *in_stack_fffffffffffffa68;
  EventAwaiter *in_stack_fffffffffffffa70;
  _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffffa78;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  buffer *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  int in_stack_fffffffffffffa9c;
  __shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
  *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  _Node_iterator_base<std::shared_ptr<nuraft::rpc_client>,_false> in_stack_fffffffffffffab0;
  _Placeholder<2> *in_stack_fffffffffffffab8;
  undefined1 local_370 [39];
  byte local_349;
  string local_348 [32];
  _Node_iterator_base<std::shared_ptr<nuraft::rpc_client>,_false> local_328;
  undefined1 local_320;
  undefined1 local_318 [32];
  string local_2f8 [88];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  _Node_iterator_base<std::shared_ptr<nuraft::rpc_client>,_false> local_240;
  undefined1 local_238;
  undefined1 local_230 [32];
  string local_210 [32];
  _Self local_1f0;
  _Self local_1e8 [3];
  string local_1d0 [32];
  string local_1b0 [48];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false>
  local_180;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false>
  local_178 [2];
  __shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> local_158 [2];
  byte local_135;
  int local_134;
  ulong local_130;
  undefined4 local_118;
  undefined1 local_111;
  cmd_result_code local_100;
  undefined1 local_f9;
  undefined1 local_b1;
  undefined4 local_b0;
  undefined1 local_a9;
  string local_a8 [32];
  __shared_ptr local_88 [20];
  int local_74;
  undefined4 local_70;
  undefined1 local_69;
  string local_68 [48];
  __shared_ptr local_38 [20];
  uint local_24;
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_24 = std::__atomic_base::operator_cast_to_int
                       ((__atomic_base<int> *)in_stack_fffffffffffffa78);
  std::shared_ptr<nuraft::buffer>::shared_ptr
            ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  if (local_24 == 0xffffffff) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fe70a);
      iVar2 = (*peVar4->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fe743);
        msg_if_given_abi_cxx11_
                  ((char *)local_68,"return null as leader does not exist in the current group");
        (*peVar4->_vptr_logger[8])
                  (peVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"send_msg_to_leader",0x77,local_68);
        std::__cxx11::string::~string(local_68);
      }
    }
    local_69 = 0;
    local_70 = 0xfffffffd;
    cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&,nuraft::cmd_result_code>
              ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa78,
               (cmd_result_code *)in_stack_fffffffffffffa70);
    local_69 = 1;
    local_74 = 1;
  }
  else if (local_24 == *(uint *)(in_RSI + 7)) {
    peVar5 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffffa70);
    (**(code **)(*in_RSI + 0x10))(local_88,in_RSI,peVar5,local_20);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_88);
    if (bVar1) {
      local_b1 = 0;
      std::
      shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
      ::shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                    *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1fea39);
      bVar1 = resp_msg::has_cb(in_stack_fffffffffffffa68);
      if (bVar1) {
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1fea6c);
        resp_msg::call_cb((resp_msg *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                          (ptr<resp_msg> *)in_stack_fffffffffffffaa0);
        std::shared_ptr<nuraft::resp_msg>::operator=
                  ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffa70,
                   (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffa68);
        std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1feaa8);
      }
      peVar6 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1feadd);
      bVar1 = resp_msg::get_accepted(peVar6);
      if (bVar1) {
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1feb0b);
        resp_msg::get_ctx(in_stack_fffffffffffffa68);
        std::shared_ptr<nuraft::buffer>::operator=
                  ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa70,
                   (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa68);
        std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1feb47);
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1feb54);
        bVar1 = resp_msg::has_async_cb(in_stack_fffffffffffffa68);
        if (bVar1) {
          std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1feb7f);
          resp_msg::call_async_cb(in_stack_fffffffffffffa68);
          std::
          shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
          ::operator=((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                       *)in_stack_fffffffffffffa70,
                      (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                       *)in_stack_fffffffffffffa68);
          std::
          shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
          ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                         *)0x1febb3);
        }
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
      if (bVar1) {
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1febd5);
        nuraft::buffer::pos(in_stack_fffffffffffffa90,
                            CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
      if (!bVar1) {
        peVar6 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1fec07);
        local_f9 = resp_msg::get_accepted(peVar6);
        peVar6 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1fec35);
        local_100 = resp_msg::get_result_code(peVar6);
        cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&,bool,nuraft::cmd_result_code>
                  ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa78,
                   (bool *)in_stack_fffffffffffffa70,(cmd_result_code *)in_stack_fffffffffffffa68);
        std::
        shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
        ::operator=((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                     *)in_stack_fffffffffffffa70,
                    (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                     *)in_stack_fffffffffffffa68);
        std::
        shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
        ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                       *)0x1fec9d);
      }
      local_b1 = 1;
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fe8d7);
        iVar2 = (*peVar4->_vptr_logger[7])();
        if (3 < iVar2) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fe910);
          msg_if_given_abi_cxx11_((char *)local_a8,"server returns null");
          (*peVar4->_vptr_logger[8])
                    (peVar4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0x80,local_a8);
          std::__cxx11::string::~string(local_a8);
        }
      }
      local_a9 = 0;
      local_b0 = 0xfffffffc;
      cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&,nuraft::cmd_result_code>
                ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa78,
                 (cmd_result_code *)in_stack_fffffffffffffa70);
      local_a9 = 1;
    }
    local_74 = 1;
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1fecd6);
  }
  else {
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1fed01);
    nuraft::context::get_params
              ((context *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    peVar7 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fed20);
    bVar1 = peVar7->auto_forwarding_;
    std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1fed39);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1fedbb);
      nuraft::context::get_params
                ((context *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      local_134 = 1;
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fede5);
      piVar8 = std::max<int>(&local_134,&peVar7->auto_forwarding_max_connections_);
      local_130 = (ulong)*piVar8;
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fee23);
      local_135 = peVar7->return_method_ == blocking;
      get_config((raft_server *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      std::shared_ptr<nuraft::rpc_client>::shared_ptr((shared_ptr<nuraft::rpc_client> *)0x1fee54);
      std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::shared_ptr
                ((shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffa70,
                 in_stack_fffffffffffffa68);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffa70,
                 (mutex_type *)in_stack_fffffffffffffa68);
      local_178[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
           ::find((unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
                   *)in_stack_fffffffffffffa68,(key_type *)0x1fee9f);
      local_180._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
           ::end((unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
                  *)in_stack_fffffffffffffa68);
      bVar1 = std::__detail::operator==(local_178,&local_180);
      if (bVar1) {
        cs_new<nuraft::raft_server::auto_fwd_pkg>();
        std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::operator=
                  ((shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffa70,
                   (shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffa68);
        std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::~shared_ptr
                  ((shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)0x1fef2c);
        std::
        unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
        ::operator[]((unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
                      *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
        std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::operator=
                  ((shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffa70,
                   (shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffa68);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
        if (bVar1) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fef98);
          iVar2 = (*peVar4->_vptr_logger[7])();
          if (5 < iVar2) {
            peVar4 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1fefd1);
            uVar3 = local_24;
            peVar9 = std::
                     __shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>::
                     get(&local_168);
            msg_if_given_abi_cxx11_
                      ((char *)local_1b0,"auto forwarding pkg for leader %d not found, created %p",
                       (ulong)uVar3,peVar9);
            (*peVar4->_vptr_logger[8])
                      (peVar4,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"send_msg_to_leader",0xbb,local_1b0);
            std::__cxx11::string::~string(local_1b0);
          }
        }
      }
      else {
        std::__detail::
        _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false,_false>
        ::operator->((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_false,_false>
                      *)0x1ff0dc);
        std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::operator=
                  ((shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffa70,
                   (shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffa68);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
        if (bVar1) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ff121);
          iVar2 = (*peVar4->_vptr_logger[7])();
          if (5 < iVar2) {
            peVar4 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1ff15a);
            uVar3 = local_24;
            peVar9 = std::
                     __shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>::
                     get(&local_168);
            msg_if_given_abi_cxx11_
                      ((char *)local_1d0,"auto forwarding pkg for leader %d exists %p",(ulong)uVar3,
                       peVar9);
            (*peVar4->_vptr_logger[8])
                      (peVar4,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"send_msg_to_leader",0xbf,local_1d0);
            std::__cxx11::string::~string(local_1d0);
          }
        }
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1ff217);
      do {
        std::
        __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1ff224);
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)in_stack_fffffffffffffa70,
                   (mutex_type *)in_stack_fffffffffffffa68);
        std::
        __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1ff247);
        local_1e8[0]._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
             ::begin((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                      *)in_stack_fffffffffffffa68);
        std::
        __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1ff264);
        local_1f0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
             ::end((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                    *)in_stack_fffffffffffffa68);
        bVar1 = std::operator==(local_1e8,&local_1f0);
        iVar2 = (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
        if (bVar1) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
          if (bVar1) {
            peVar4 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1ff2c3);
            iVar2 = (*peVar4->_vptr_logger[7])();
            if (5 < iVar2) {
              peVar4 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1ff2fc);
              std::
              __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1ff319);
              sVar10 = std::__cxx11::
                       list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                       ::size((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                               *)in_stack_fffffffffffffa70);
              std::
              __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1ff336);
              sVar11 = std::
                       unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                       ::size((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                               *)0x1ff342);
              msg_if_given_abi_cxx11_
                        ((char *)local_210,"no connection available, idle %zu, in-use %zu, max %zu",
                         sVar10,sVar11,local_130);
              (*peVar4->_vptr_logger[8])
                        (peVar4,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                         ,"send_msg_to_leader",0xce,local_210);
              std::__cxx11::string::~string(local_210);
            }
          }
          std::
          __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1ff40e);
          sVar10 = std::__cxx11::
                   list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                   ::size((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                           *)in_stack_fffffffffffffa70);
          std::
          __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1ff42b);
          sVar11 = std::
                   unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                   ::size((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                           *)0x1ff437);
          if (sVar10 + sVar11 < local_130) {
            std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1ff460);
            cluster_config::get_server
                      ((cluster_config *)
                       CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                       (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
            std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                      ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)
                       0x1ff48d);
            peVar12 = std::
                      __shared_ptr_access<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1ff499);
            peVar14 = std::
                      __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1ff4ae);
            psVar15 = srv_config::get_endpoint_abi_cxx11_(peVar14);
            (*peVar12->_vptr_rpc_client_factory[2])(local_230,peVar12,psVar15);
            std::shared_ptr<nuraft::rpc_client>::operator=
                      ((shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffa70,
                       (shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffa68);
            std::shared_ptr<nuraft::rpc_client>::~shared_ptr
                      ((shared_ptr<nuraft::rpc_client> *)0x1ff515);
            std::
            __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1ff522);
            pVar17 = std::
                     unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                     ::insert((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                               *)in_stack_fffffffffffffa80,(value_type *)in_stack_fffffffffffffa78);
            local_240._M_cur =
                 (__node_type *)
                 pVar17.first.super__Node_iterator_base<std::shared_ptr<nuraft::rpc_client>,_false>.
                 _M_cur;
            local_238 = pVar17.second;
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
            if (bVar1) {
              peVar4 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1ff596);
              iVar2 = (*peVar4->_vptr_logger[7])();
              if (5 < iVar2) {
                peVar4 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x1ff5cf);
                peVar16 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::get
                                    (local_158);
                msg_if_given_abi_cxx11_((char *)local_260,"created a new connection %p",peVar16);
                (*peVar4->_vptr_logger[8])
                          (peVar4,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                           ,"send_msg_to_leader",0xd6,local_260);
                std::__cxx11::string::~string(local_260);
              }
            }
            std::shared_ptr<nuraft::srv_config>::~shared_ptr
                      ((shared_ptr<nuraft::srv_config> *)0x1ff688);
            goto LAB_001ffdad;
          }
          if ((local_135 & 1) == 0) {
            auto_fwd_req_resp::auto_fwd_req_resp((auto_fwd_req_resp *)in_stack_fffffffffffffa70);
            std::shared_ptr<nuraft::req_msg>::operator=
                      ((shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffa70,
                       (shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffa68);
            cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>
                      ();
            std::
            shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
            ::operator=((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                         *)in_stack_fffffffffffffa70,
                        (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                         *)in_stack_fffffffffffffa68);
            std::
            shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
            ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                           *)0x1ff969);
            std::lock_guard<std::mutex>::lock_guard
                      ((lock_guard<std::mutex> *)in_stack_fffffffffffffa70,
                       (mutex_type *)in_stack_fffffffffffffa68);
            std::__cxx11::
            list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
            ::push_back((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                         *)in_stack_fffffffffffffa80,(value_type *)in_stack_fffffffffffffa78);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
            if (bVar1) {
              peVar4 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1ff9d6);
              iVar2 = (*peVar4->_vptr_logger[7])();
              if (5 < iVar2) {
                peVar4 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x1ffa09);
                sVar10 = std::__cxx11::
                         list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                         ::size((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                                 *)in_stack_fffffffffffffa70);
                msg_if_given_abi_cxx11_
                          ((char *)local_2f8,"reached max connection, put into the queue, %zu elems"
                           ,sVar10);
                (*peVar4->_vptr_logger[8])
                          (peVar4,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                           ,"send_msg_to_leader",0xec,local_2f8);
                std::__cxx11::string::~string(local_2f8);
              }
            }
            std::
            shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
            ::shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                          *)in_stack_fffffffffffffa70,
                         (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                          *)in_stack_fffffffffffffa68);
            local_74 = 1;
            std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1ffb00);
            auto_fwd_req_resp::~auto_fwd_req_resp((auto_fwd_req_resp *)in_stack_fffffffffffffa70);
          }
          else {
            std::unique_lock<std::mutex>::unlock
                      ((unique_lock<std::mutex> *)in_stack_fffffffffffffa70);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
            if (bVar1) {
              peVar4 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1ff6ed);
              iVar2 = (*peVar4->_vptr_logger[7])();
              if (5 < iVar2) {
                peVar4 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x1ff726);
                msg_if_given_abi_cxx11_((char *)local_280,"reached max connection, wait");
                (*peVar4->_vptr_logger[8])
                          (peVar4,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                           ,"send_msg_to_leader",0xdd,local_280);
                std::__cxx11::string::~string(local_280);
              }
            }
            std::
            __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1ff7bc);
            std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1ff7d5);
            EventAwaiter::wait_ms(in_stack_fffffffffffffa70,(size_t)in_stack_fffffffffffffa68);
            std::
            __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1ff7f5);
            EventAwaiter::reset((EventAwaiter *)0x1ff801);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
            if (bVar1) {
              peVar4 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1ff834);
              iVar2 = (*peVar4->_vptr_logger[7])();
              if (5 < iVar2) {
                peVar4 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x1ff86d);
                msg_if_given_abi_cxx11_((char *)local_2a0,"wake up, find an available connection");
                (*peVar4->_vptr_logger[8])
                          (peVar4,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                           ,"send_msg_to_leader",0xe0,local_2a0);
                std::__cxx11::string::~string(local_2a0);
              }
            }
            local_74 = 3;
          }
        }
        else {
          std::_List_iterator<std::shared_ptr<nuraft::rpc_client>_>::operator*
                    ((_List_iterator<std::shared_ptr<nuraft::rpc_client>_> *)0x1ffb43);
          std::shared_ptr<nuraft::rpc_client>::operator=
                    ((shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffa70,
                     (shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffa68);
          peVar13 = std::
                    __shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1ffb62);
          uVar3 = (*peVar13->_vptr_rpc_client[4])();
          if ((uVar3 & 1) != 0) {
            std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1ffb8e);
            cluster_config::get_server
                      ((cluster_config *)
                       CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),iVar2);
            std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                      ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)
                       0x1ffbbb);
            in_stack_fffffffffffffab8 =
                 (_Placeholder<2> *)
                 std::
                 __shared_ptr_access<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ffbc7);
            peVar14 = std::
                      __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1ffbd9);
            psVar15 = srv_config::get_endpoint_abi_cxx11_(peVar14);
            (*(*(_func_int ***)in_stack_fffffffffffffab8)[2])
                      (local_318,in_stack_fffffffffffffab8,psVar15);
            std::shared_ptr<nuraft::rpc_client>::operator=
                      ((shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffa70,
                       (shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffa68);
            std::shared_ptr<nuraft::rpc_client>::~shared_ptr
                      ((shared_ptr<nuraft::rpc_client> *)0x1ffc27);
            std::shared_ptr<nuraft::srv_config>::~shared_ptr
                      ((shared_ptr<nuraft::srv_config> *)0x1ffc34);
          }
          in_stack_fffffffffffffaa0 = &local_168;
          std::
          __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1ffc6e);
          std::__cxx11::
          list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
          ::pop_front((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                       *)in_stack_fffffffffffffa70);
          std::
          __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1ffc80);
          pVar17 = std::
                   unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                   ::insert((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                             *)in_stack_fffffffffffffa80,(value_type *)in_stack_fffffffffffffa78);
          in_stack_fffffffffffffab0._M_cur =
               (__node_type *)
               pVar17.first.super__Node_iterator_base<std::shared_ptr<nuraft::rpc_client>,_false>.
               _M_cur;
          in_stack_fffffffffffffaaf = pVar17.second;
          local_328._M_cur = in_stack_fffffffffffffab0._M_cur;
          local_320 = in_stack_fffffffffffffaaf;
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
          if (bVar1) {
            peVar4 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1ffce8);
            in_stack_fffffffffffffa9c = (*peVar4->_vptr_logger[7])();
            if (5 < in_stack_fffffffffffffa9c) {
              in_stack_fffffffffffffa90 =
                   (buffer *)
                   std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ffd1b);
              peVar16 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::get
                                  (local_158);
              msg_if_given_abi_cxx11_((char *)local_348,"idle connection %p",peVar16);
              (*(*(_func_int ***)in_stack_fffffffffffffa90)[8])
                        (in_stack_fffffffffffffa90,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                         ,"send_msg_to_leader",0xfb,local_348);
              std::__cxx11::string::~string(local_348);
            }
          }
LAB_001ffdad:
          local_74 = 2;
        }
        std::unique_lock<std::mutex>::~unique_lock
                  ((unique_lock<std::mutex> *)in_stack_fffffffffffffa70);
        if (local_74 == 2) {
          iVar2 = local_74;
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_158);
          if (bVar1) {
            local_349 = 0;
            cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>
                      ();
            std::
            bind<void(nuraft::raft_server::*)(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&),nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>&,std::shared_ptr<nuraft::rpc_client>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                      ((offset_in_raft_server_to_subr *)
                       CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                       (raft_server **)in_stack_fffffffffffffa90,
                       (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                        *)CONCAT44(iVar2,in_stack_fffffffffffffa88),
                       (shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffa80,
                       (shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffa78,
                       (_Placeholder<1> *)in_stack_fffffffffffffab0._M_cur,in_stack_fffffffffffffab8
                      );
            std::
            function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
            ::
            function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
                      (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
            std::
            _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
            ::~_Bind((_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                      *)0x1ffef0);
            peVar13 = std::
                      __shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1ffefd);
            peVar7 = std::
                     __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1fff1c);
            (*peVar13->_vptr_rpc_client[2])
                      (peVar13,local_18,local_370,(long)peVar7->auto_forwarding_req_timeout_);
            peVar7 = std::
                     __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1fff4a);
            if (peVar7->return_method_ == blocking) {
              std::
              __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1fff5d);
              cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::get
                        ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                          *)CONCAT44(iVar2,in_stack_fffffffffffffa88));
            }
            local_349 = 1;
            local_74 = 1;
            std::
            function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
            ::~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                         *)0x1fffe5);
            if ((local_349 & 1) == 0) {
              std::
              shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
              ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                             *)0x1ffffc);
            }
          }
          else {
            cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&>
                      ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa68);
            local_74 = 1;
          }
          break;
        }
      } while (local_74 == 3);
      std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>::~shared_ptr
                ((shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)0x20001a);
      std::shared_ptr<nuraft::rpc_client>::~shared_ptr((shared_ptr<nuraft::rpc_client> *)0x200027);
      std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                ((shared_ptr<nuraft::cluster_config> *)0x200034);
      std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x200041)
      ;
    }
    else {
      local_111 = 0;
      local_118 = 0xfffffffd;
      cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&,nuraft::cmd_result_code>
                ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa78,
                 (cmd_result_code *)in_stack_fffffffffffffa70);
      local_74 = 1;
      local_111 = 1;
    }
  }
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x200086);
  pVar18.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  pVar18.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar18.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::send_msg_to_leader
                                 ( ptr<req_msg>& req,
                                   const req_ext_params& ext_params )
{
    int32 leader_id = leader_;
    ptr<buffer> result = nullptr;
    if (leader_id == -1) {
        p_in("return null as leader does not exist in the current group");
        ptr< cmd_result< ptr<buffer> > > ret =
            cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::NOT_LEADER);
        return ret;
    }

    if (leader_id == id_) {
        ptr<resp_msg> resp = process_req(*req, ext_params);
        if (!resp) {
            p_in("server returns null");
            ptr< cmd_result< ptr<buffer> > > ret =
                cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::BAD_REQUEST);
            return ret;
        }

        ptr< cmd_result< ptr<buffer> > > ret = nullptr;
        if (resp->has_cb()) {
            // Blocking mode:
            //   If callback function exists, get new response message
            //   from the callback function.
            resp = resp->call_cb(resp);
        }

        if (resp->get_accepted()) {
            result = resp->get_ctx();

            if (resp->has_async_cb()) {
                // Async handler mode (only when accepted):
                //   Get handler (async_result) from the callback.
                ret = resp->call_async_cb();
            }
        }
        if (result) {
            result->pos(0);
        }

        if (!ret) {
            // In blocking mode,
            // we already have result when we reach here.
            ret = cs_new< cmd_result< ptr<buffer> > >
                  ( result, resp->get_accepted(), resp->get_result_code() );
        }
        return ret;
    }
    if (!ctx_->get_params()->auto_forwarding_) {
        // Auto-forwarding is disabled, return error.
        ptr< cmd_result< ptr<buffer> > > ret =
            cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::NOT_LEADER);
        return ret;
    }

    // Otherwise: re-direct request to the current leader
    //            (not recommended).
    ptr<raft_params> params = ctx_->get_params();
    size_t max_conns =
        std::max(1, params->auto_forwarding_max_connections_);
    bool is_blocking_mode = (params->return_method_ == raft_params::blocking);

    ptr<cluster_config> c_conf = get_config();
    ptr<rpc_client> rpc_cli;
    ptr<auto_fwd_pkg> cur_pkg = nullptr;
    {
        auto_lock(rpc_clients_lock_);
        auto entry = auto_fwd_pkgs_.find(leader_id);
        if (entry == auto_fwd_pkgs_.end()) {
            cur_pkg = cs_new<auto_fwd_pkg>();
            auto_fwd_pkgs_[leader_id] = cur_pkg;
            p_tr("auto forwarding pkg for leader %d not found, created %p",
                 leader_id, cur_pkg.get());
        } else {
            cur_pkg = entry->second;
            p_tr("auto forwarding pkg for leader %d exists %p",
                 leader_id, cur_pkg.get());
        }
    }

    // Find available `rpc_cli`.
    do {
        std::unique_lock<std::mutex> l(cur_pkg->lock_);
        // Get an idle connection.
        auto e_rpc = cur_pkg->rpc_client_idle_.begin();
        if (e_rpc == cur_pkg->rpc_client_idle_.end()) {
            // Idle connection doesn't exist,
            // check the total number of connections.
            p_tr( "no connection available, idle %zu, in-use %zu, max %zu",
                   cur_pkg->rpc_client_idle_.size(),
                   cur_pkg->rpc_client_in_use_.size(),
                   max_conns );
            if ( cur_pkg->rpc_client_idle_.size() +
                 cur_pkg->rpc_client_in_use_.size() < max_conns ) {
                // We can create more connections.
                ptr<srv_config> srv_conf = c_conf->get_server(leader_id);
                rpc_cli = ctx_->rpc_cli_factory_->create_client
                          ( srv_conf->get_endpoint() );
                cur_pkg->rpc_client_in_use_.insert(rpc_cli);
                p_tr("created a new connection %p", rpc_cli.get());

            } else {
                // Already reached the max, wait for idle connection.
                if (is_blocking_mode) {
                    // Blocking mode, sleep here.
                    l.unlock();
                    p_tr("reached max connection, wait");
                    cur_pkg->ea_.wait_ms(params->client_req_timeout_);
                    cur_pkg->ea_.reset();
                    p_tr("wake up, find an available connection");
                    continue;

                } else {
                    // Async mode, put it into the queue, and return immediately.
                    auto_fwd_req_resp req_resp_pair;
                    req_resp_pair.req = req;
                    req_resp_pair.resp = cs_new< cmd_result< ptr<buffer> > >();

                    auto_lock(auto_fwd_reqs_lock_);
                    auto_fwd_reqs_.push_back(req_resp_pair);
                    p_tr("reached max connection, put into the queue, %zu elems",
                         auto_fwd_reqs_.size());
                    return req_resp_pair.resp;
                }
            }
        } else {
            // Put the idle connection to in-use list.
            rpc_cli = *e_rpc;
            if (rpc_cli->is_abandoned()) {
                // Abandoned connection, need to reconnect.
                ptr<srv_config> srv_conf = c_conf->get_server(leader_id);
                rpc_cli = ctx_->rpc_cli_factory_->create_client
                          ( srv_conf->get_endpoint() );
            }
            cur_pkg->rpc_client_idle_.pop_front();
            cur_pkg->rpc_client_in_use_.insert(rpc_cli);
            p_tr("idle connection %p", rpc_cli.get());
        }
        break;
    } while(true);

    if (!rpc_cli) {
        return cs_new< cmd_result< ptr<buffer> > >(result);
    }

    ptr< cmd_result< ptr<buffer> > >
        presult( cs_new< cmd_result< ptr<buffer> > >() );

    rpc_handler handler = std::bind( &raft_server::auto_fwd_resp_handler,
                                     this,
                                     presult,
                                     cur_pkg,
                                     rpc_cli,
                                     std::placeholders::_1,
                                     std::placeholders::_2 );
    rpc_cli->send(req, handler, params->auto_forwarding_req_timeout_);

    if (params->return_method_ == raft_params::blocking) {
        presult->get();
    }

    return presult;
}